

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::Marray<float,std::allocator<unsigned_long>>::
Marray<float,false,std::allocator<unsigned_long>>
          (Marray<float,std::allocator<unsigned_long>> *this,
          View<float,_false,_std::allocator<unsigned_long>_> *in)

{
  size_t *psVar1;
  long lVar2;
  size_type __n;
  unsigned_long *__dest;
  size_t sVar3;
  float *pfVar4;
  runtime_error *prVar5;
  ulong uVar6;
  const_iterator it;
  Iterator<float,_true,_std::allocator<unsigned_long>_> local_48;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined4 *)(this + 0x38) = 1;
  this[0x3c] = (Marray<float,std::allocator<unsigned_long>>)0x1;
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
  if (in != (View<float,_false,_std::allocator<unsigned_long>_> *)this) {
    sVar3 = (in->geometry_).dimension_;
    __dest = *(unsigned_long **)(this + 0x10);
    if (sVar3 != *(size_t *)(this + 0x28)) {
      operator_delete(__dest,*(size_t *)(this + 0x28) * 0x18);
      sVar3 = (in->geometry_).dimension_;
      *(size_t *)(this + 0x28) = sVar3;
      __dest = __gnu_cxx::new_allocator<unsigned_long>::allocate
                         ((new_allocator<unsigned_long> *)(this + 8),sVar3 * 3,(void *)0x0);
      *(unsigned_long **)(this + 0x10) = __dest;
      *(unsigned_long **)(this + 0x18) = __dest + *(long *)(this + 0x28);
      *(unsigned_long **)(this + 0x20) = __dest + *(long *)(this + 0x28) + *(long *)(this + 0x28);
      sVar3 = (in->geometry_).dimension_;
      *(size_t *)(this + 0x28) = sVar3;
    }
    memcpy(__dest,(in->geometry_).shape_,sVar3 * 0x18);
    *(size_t *)(this + 0x30) = (in->geometry_).size_;
    *(CoordinateOrder *)(this + 0x38) = (in->geometry_).coordinateOrder_;
    this[0x3c] = (Marray<float,std::allocator<unsigned_long>>)(in->geometry_).isSimple_;
  }
  if (in->data_ != (pointer)0x0) {
    if ((in->geometry_).dimension_ != 0) {
      psVar1 = (in->geometry_).shapeStrides_;
      lVar2 = *(long *)(this + 0x20);
      uVar6 = 0;
      do {
        if (*(ulong *)(this + 0x28) <= uVar6) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"Assertion failed.");
          goto LAB_00122ac6;
        }
        *(size_t *)(lVar2 + uVar6 * 8) = psVar1[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar6 < (in->geometry_).dimension_);
    }
    this[0x3c] = (Marray<float,std::allocator<unsigned_long>>)0x1;
    __n = (in->geometry_).size_;
    if (__n == 0) {
      pfVar4 = (float *)0x0;
    }
    else {
      pfVar4 = __gnu_cxx::new_allocator<float>::allocate
                         ((new_allocator<float> *)(this + 0x40),__n,(void *)0x0);
    }
    *(float **)this = pfVar4;
    View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
    if ((in->geometry_).isSimple_ == true) {
      memcpy(*(void **)this,in->data_,(in->geometry_).size_ << 2);
    }
    else {
      View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
      Iterator<float,_true,_std::allocator<unsigned_long>_>::Iterator(&local_48,in,0);
      for (uVar6 = 0; uVar6 < *(ulong *)(this + 0x30); uVar6 = uVar6 + 1) {
        if ((local_48.view_ == (view_pointer)0x0) ||
           (*(ulong *)(local_48.view_ + 0x30) <= local_48.index_)) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"Assertion failed.");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        *(float *)(*(long *)this + uVar6 * 4) = *local_48.pointer_;
        Iterator<float,_true,_std::allocator<unsigned_long>_>::operator++(&local_48);
      }
      if (local_48.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
              ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
    if (this[0x3c] != (Marray<float,std::allocator<unsigned_long>>)0x0) {
      return;
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Assertion failed.");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar5,"Assertion failed.");
LAB_00122ac6:
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
Marray<T, A>::Marray
(
    const View<TLocal, isConstLocal, ALocal>& in
) 
: dataAllocator_()
{
    if(!MARRAY_NO_ARG_TEST) {
        in.testInvariant();
    }

    // adapt geometry
    this->geometry_ = in.geometry_;
    for(std::size_t j=0; j<in.dimension(); ++j) {
        this->geometry_.strides(j) = in.geometry_.shapeStrides(j); // !
    }
    this->geometry_.isSimple() = true;

    // copy data
    if(in.size() == 0) {
        this->data_ = 0;
    }
    else {
        this->data_ = dataAllocator_.allocate(in.size());
    }
    if(in.isSimple() && marray_detail::IsEqual<T, TLocal>::type) {
        memcpy(this->data_, in.data_, (in.size())*sizeof(T));
    }
    else {
        typename View<TLocal, isConstLocal, ALocal>::const_iterator it = in.begin();
        for(std::size_t j=0; j<this->size(); ++j, ++it)  {
            this->data_[j] = static_cast<T>(*it);
        }
    }

    testInvariant();
}